

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XModule.c
# Opt level: O0

cs_err M680X_global_init(cs_struct *ud)

{
  void *pvVar1;
  cs_struct *in_RDI;
  cs_err errcode;
  m680x_info *info;
  cs_err local_4;
  
  local_4 = M680X_disassembler_init(in_RDI);
  if ((local_4 == CS_ERR_OK) && (local_4 = M680X_instprinter_init(in_RDI), local_4 == CS_ERR_OK)) {
    if ((in_RDI->mode &
        ~(CS_MODE_M680X_HCS08|CS_MODE_M680X_CPU12|CS_MODE_M680X_6811|CS_MODE_M680X_6809|
          CS_MODE_M680X_6808|CS_MODE_M680X_6805|CS_MODE_M680X_6801|CS_MODE_64|CS_MODE_32|CS_MODE_16)
        ) == CS_MODE_ARM) {
      if ((in_RDI->mode &
          (CS_MODE_M680X_HCS08|CS_MODE_M680X_CPU12|CS_MODE_M680X_6811|CS_MODE_M680X_6809|
           CS_MODE_M680X_6808|CS_MODE_M680X_6805|CS_MODE_M680X_6801|CS_MODE_64|CS_MODE_32|CS_MODE_16
          )) == CS_MODE_ARM) {
        local_4 = CS_ERR_MODE;
      }
      else {
        pvVar1 = (*cs_mem_malloc)(0x100);
        if (pvVar1 == (void *)0x0) {
          local_4 = CS_ERR_MEM;
        }
        else {
          in_RDI->printer = M680X_printInst;
          in_RDI->printer_info = pvVar1;
          in_RDI->getinsn_info = (void *)0x0;
          in_RDI->disasm = M680X_getInstruction;
          in_RDI->reg_name = M680X_reg_name;
          in_RDI->insn_id = M680X_get_insn_id;
          in_RDI->insn_name = M680X_insn_name;
          in_RDI->group_name = M680X_group_name;
          in_RDI->skipdata_size = '\x01';
          in_RDI->post_printer = (PostPrinter_t)0x0;
          in_RDI->reg_access = M680X_reg_access;
          local_4 = CS_ERR_OK;
        }
      }
    }
    else {
      local_4 = CS_ERR_MODE;
    }
  }
  return local_4;
}

Assistant:

cs_err M680X_global_init(cs_struct *ud)
{
	m680x_info *info;
	cs_err errcode;

	/* Do some validation checks */
	errcode = M680X_disassembler_init(ud);

	if (errcode != CS_ERR_OK)
		return errcode;

	errcode =  M680X_instprinter_init(ud);

	if (errcode != CS_ERR_OK)
		return errcode;

	// verify if requested mode is valid
	if (ud->mode & ~(CS_MODE_M680X_6800 | CS_MODE_M680X_6801 |
			CS_MODE_M680X_6805 | CS_MODE_M680X_6808 |
			CS_MODE_M680X_6809 | CS_MODE_M680X_6811 |
			CS_MODE_M680X_6301 | CS_MODE_M680X_6309 |
			CS_MODE_M680X_CPU12 | CS_MODE_M680X_HCS08)) {
		// At least one mode is not supported by M680X
		return CS_ERR_MODE;
	}

	if (!(ud->mode & (CS_MODE_M680X_6800 | CS_MODE_M680X_6801 |
				CS_MODE_M680X_6805 | CS_MODE_M680X_6808 |
				CS_MODE_M680X_6809 | CS_MODE_M680X_6811 |
				CS_MODE_M680X_6301 | CS_MODE_M680X_6309 |
				CS_MODE_M680X_CPU12 | CS_MODE_M680X_HCS08))) {
		// At least the cpu type has to be selected. No default.
		return CS_ERR_MODE;
	}

	info = cs_mem_malloc(sizeof(m680x_info));

	if (!info)
		return CS_ERR_MEM;

	ud->printer = M680X_printInst;
	ud->printer_info = info;
	ud->getinsn_info = NULL;
	ud->disasm = M680X_getInstruction;
	ud->reg_name = M680X_reg_name;
	ud->insn_id = M680X_get_insn_id;
	ud->insn_name = M680X_insn_name;
	ud->group_name = M680X_group_name;
	ud->skipdata_size = 1;
	ud->post_printer = NULL;
#ifndef CAPSTONE_DIET
	ud->reg_access = M680X_reg_access;
#endif

	return CS_ERR_OK;
}